

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

void * dtl_sv_to_ptr(dtl_sv_t *self)

{
  dtl_sv_type_id dVar1;
  dtl_sv_t *self_local;
  
  if (self != (dtl_sv_t *)0x0) {
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      return (void *)(long)(self->pAny->val).i32;
    case DTL_SV_U32:
      return (void *)(ulong)(self->pAny->val).u32;
    case DTL_SV_I64:
      break;
    case DTL_SV_U64:
      break;
    case DTL_SV_FLT:
      break;
    case DTL_SV_DBL:
      break;
    case DTL_SV_CHAR:
      break;
    case DTL_SV_BOOL:
      break;
    case DTL_SV_STR:
      return &self->pAny->val;
    case DTL_SV_PTR:
      return (self->pAny->val).str;
    case DTL_SV_DV:
      return (self->pAny->val).str;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  return (void *)0x0;
}

Assistant:

void* dtl_sv_to_ptr(const dtl_sv_t *self){
   if(self){
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
#ifdef _WIN64
         return IntToPtr(self->pAny->val.i32);
#else
         return (void*) ((long) self->pAny->val.i32);
#endif
      case DTL_SV_U32:
#ifdef _WIN64
         return UIntToPtr(self->pAny->val.u32);
#else
         return (void*) ((unsigned long) self->pAny->val.u32);
#endif
      case DTL_SV_I64:
         break;
      case DTL_SV_U64:
         break;
      case DTL_SV_FLT:
         break;
      case DTL_SV_DBL:
         break;
      case DTL_SV_CHAR:
         break;
      case DTL_SV_BOOL:
         break;
      case DTL_SV_STR:
         return (void*) &self->pAny->val.str;
         break;
      case DTL_SV_PTR:
         return self->pAny->val.ptr.p;
         break;
      case DTL_SV_DV:
         return (void*) self->pAny->val.dv;
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   return (void*)0;
}